

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

void __thiscall TasgridWrapper::outputIndexes(TasgridWrapper *this,output_points_mode mode)

{
  int iVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  double *pdVar5;
  int local_74;
  undefined1 local_50 [8];
  Data2D<double> pv;
  int num_points;
  int *p;
  output_points_mode mode_local;
  TasgridWrapper *this_local;
  
  if (mode == needed) {
    lVar3 = TasGrid::TasmanianSparseGrid::getNeededIndexes();
    local_74 = TasGrid::TasmanianSparseGrid::getNumNeeded(&this->grid);
  }
  else {
    lVar3 = TasGrid::TasmanianSparseGrid::getPointsIndexes();
    local_74 = TasGrid::TasmanianSparseGrid::getNumPoints(&this->grid);
  }
  pv.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = local_74;
  TasGrid::Data2D<double>::Data2D<int,int>((Data2D<double> *)local_50,this->num_dimensions,local_74)
  ;
  sVar4 = TasGrid::Utils::size_mult<int,int>
                    (pv.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,this->num_dimensions);
  pdVar5 = TasGrid::Data2D<double>::getStrip((Data2D<double> *)local_50,0);
  std::
  transform<int_const*,double*,TasgridWrapper::outputIndexes(TasgridWrapper::output_points_mode)const::__0>
            (lVar3,lVar3 + sVar4 * 4,pdVar5);
  iVar2 = pv.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._4_4_;
  iVar1 = this->num_dimensions;
  pdVar5 = TasGrid::Data2D<double>::getStrip((Data2D<double> *)local_50,0);
  writeMatrix(this,&this->outfilename,iVar2,iVar1,pdVar5);
  iVar2 = pv.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._4_4_;
  iVar1 = this->num_dimensions;
  pdVar5 = TasGrid::Data2D<double>::getStrip((Data2D<double> *)local_50,0);
  printMatrix(this,iVar2,iVar1,pdVar5,false);
  TasGrid::Data2D<double>::~Data2D((Data2D<double> *)local_50);
  return;
}

Assistant:

void TasgridWrapper::outputIndexes(output_points_mode mode) const{
    const int *p = (mode == output_points_mode::needed) ? grid.getNeededIndexes() : grid.getPointsIndexes();
    int num_points = (mode == output_points_mode::needed) ? grid.getNumNeeded() : grid.getNumPoints();
    Data2D<double> pv(num_dimensions, num_points);
    std::transform(p, p + Utils::size_mult(num_points, num_dimensions), pv.getStrip(0), [](int i)->double{ return double(i); });

    writeMatrix(outfilename, num_points, num_dimensions, pv.getStrip(0));
    printMatrix(num_points, num_dimensions, pv.getStrip(0));
}